

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

void __thiscall leveldb::log::_Test_MarginalTrailer2::_Run(_Test_MarginalTrailer2 *this)

{
  undefined1 local_b40 [448];
  size_t local_980;
  int local_974;
  Tester local_970;
  undefined1 local_7d0 [448];
  undefined1 local_610 [448];
  undefined1 local_450 [40];
  string local_428 [32];
  log local_408 [32];
  Tester local_3e8;
  allocator local_241;
  string local_240 [32];
  size_t local_220;
  int local_214;
  Tester local_210;
  allocator local_59;
  string local_58 [32];
  log local_38 [36];
  undefined4 local_14;
  _Test_MarginalTrailer2 *p_Stack_10;
  int n;
  _Test_MarginalTrailer2 *this_local;
  
  local_14 = 0x7ff2;
  p_Stack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"foo",&local_59);
  BigString(local_38,(string *)local_58,0x7ff2);
  LogTest::Write(&this->super_LogTest,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  test::Tester::Tester
            (&local_210,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x139);
  local_214 = 0x7ff9;
  local_220 = LogTest::WrittenBytes(&this->super_LogTest);
  test::Tester::IsEq<int,unsigned_long>(&local_210,&local_214,&local_220);
  test::Tester::~Tester(&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"bar",&local_241);
  LogTest::Write(&this->super_LogTest,(string *)local_240);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  test::Tester::Tester
            (&local_3e8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"foo",(allocator *)(local_450 + 0x27));
  BigString(local_408,(string *)local_428,0x7ff2);
  LogTest::Read_abi_cxx11_((LogTest *)local_450);
  test::Tester::IsEq<std::__cxx11::string,std::__cxx11::string>
            (&local_3e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_408,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  std::__cxx11::string::~string((string *)local_450);
  std::__cxx11::string::~string((string *)local_408);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)(local_450 + 0x27));
  test::Tester::~Tester(&local_3e8);
  test::Tester::Tester
            ((Tester *)(local_610 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13c);
  LogTest::Read_abi_cxx11_((LogTest *)local_610);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_610 + 0x20),(char (*) [4])"bar",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
  std::__cxx11::string::~string((string *)local_610);
  test::Tester::~Tester((Tester *)(local_610 + 0x20));
  test::Tester::Tester
            ((Tester *)(local_7d0 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13d);
  LogTest::Read_abi_cxx11_((LogTest *)local_7d0);
  test::Tester::IsEq<char[4],std::__cxx11::string>
            ((Tester *)(local_7d0 + 0x20),(char (*) [4])"EOF",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d0);
  std::__cxx11::string::~string((string *)local_7d0);
  test::Tester::~Tester((Tester *)(local_7d0 + 0x20));
  test::Tester::Tester
            (&local_970,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13e);
  local_974 = 0;
  local_980 = LogTest::DroppedBytes(&this->super_LogTest);
  test::Tester::IsEq<int,unsigned_long>(&local_970,&local_974,&local_980);
  test::Tester::~Tester(&local_970);
  test::Tester::Tester
            ((Tester *)(local_b40 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x13f);
  LogTest::ReportMessage_abi_cxx11_((LogTest *)local_b40);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            ((Tester *)(local_b40 + 0x20),(char (*) [1])0x11b022,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b40);
  std::__cxx11::string::~string((string *)local_b40);
  test::Tester::~Tester((Tester *)(local_b40 + 0x20));
  return;
}

Assistant:

TEST(LogTest, MarginalTrailer2) {
  // Make a trailer that is exactly the same length as an empty record.
  const int n = kBlockSize - 2 * kHeaderSize;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize, WrittenBytes());
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(0, DroppedBytes());
  ASSERT_EQ("", ReportMessage());
}